

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Errors.h
# Opt level: O3

string * soul::CompileMessageHelpers::replaceArgument
                   (string *__return_storage_ptr__,string *text,size_t index,string *value)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  bool bVar3;
  string_view firstReplacement;
  string_view firstReplacement_00;
  string *psVar4;
  char cVar5;
  long *plVar6;
  size_t sVar7;
  long *plVar8;
  long *plVar9;
  char cVar10;
  string_view firstToReplace;
  string_view firstToReplace_00;
  string i;
  size_t in_stack_fffffffffffffe98;
  long *plVar11;
  long local_150;
  long lStack_148;
  long *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_138;
  long local_130;
  undefined4 uStack_128;
  undefined4 uStack_124;
  long *local_120;
  char *local_118;
  long local_110;
  long lStack_108;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  long *local_c0 [2];
  long local_b0 [2];
  string *local_a0;
  string *local_98;
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  cVar10 = '\x01';
  if (9 < index) {
    sVar7 = index;
    cVar5 = '\x04';
    do {
      cVar10 = cVar5;
      if (sVar7 < 100) {
        cVar10 = cVar10 + -2;
        goto LAB_001c873a;
      }
      if (sVar7 < 1000) {
        cVar10 = cVar10 + -1;
        goto LAB_001c873a;
      }
      if (sVar7 < 10000) goto LAB_001c873a;
      bVar3 = 99999 < sVar7;
      sVar7 = sVar7 / 10000;
      cVar5 = cVar10 + '\x04';
    } while (bVar3);
    cVar10 = cVar10 + '\x01';
  }
LAB_001c873a:
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  local_98 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct((ulong)&local_e0,cVar10);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_e0._M_dataplus._M_p,(uint)local_e0._M_string_length,index);
  local_c0[0] = local_b0;
  pcVar1 = (text->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c0,pcVar1,pcVar1 + text->_M_string_length);
  std::operator+(&local_50,"$Q",&local_e0);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_140 = &local_130;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_130 = *plVar8;
    uStack_128 = (undefined4)plVar6[3];
    uStack_124 = *(undefined4 *)((long)plVar6 + 0x1c);
  }
  else {
    local_130 = *plVar8;
    local_140 = (long *)*plVar6;
  }
  plVar9 = local_140;
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  pcVar1 = (value->_M_dataplus)._M_p;
  local_138 = pbVar2;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar1,pcVar1 + value->_M_string_length);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x27f40c);
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_150 = *plVar8;
    lStack_148 = plVar6[3];
    plVar11 = &local_150;
  }
  else {
    local_150 = *plVar8;
    plVar11 = (long *)*plVar6;
  }
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_a0 = value;
  plVar6 = (long *)std::__cxx11::string::append(&stack0xfffffffffffffea0);
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_110 = *plVar8;
    lStack_108 = plVar6[3];
    local_120 = &local_110;
  }
  else {
    local_110 = *plVar8;
    local_120 = (long *)*plVar6;
  }
  local_118 = (char *)plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (plVar11 != &local_150) {
    operator_delete(plVar11,local_150 + 1);
  }
  firstReplacement._M_str = (char *)plVar11;
  firstReplacement._M_len = in_stack_fffffffffffffe98;
  firstToReplace._M_str = local_118;
  firstToReplace._M_len = (size_t)plVar9;
  choc::text::replace<std::__cxx11::string>
            (&local_100,(text *)local_c0,pbVar2,firstToReplace,firstReplacement);
  std::__cxx11::string::operator=((string *)text,(string *)&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if (local_120 != &local_110) {
    operator_delete(local_120,local_110 + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_140 != &local_130) {
    operator_delete(local_140,local_130 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_c0[0] != local_b0) {
    operator_delete(local_c0[0],local_b0[0] + 1);
  }
  pcVar1 = (text->_M_dataplus)._M_p;
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,pcVar1,pcVar1 + text->_M_string_length);
  std::operator+(&local_100,"$",&local_e0);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_100);
  psVar4 = local_98;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_150 = *plVar8;
    lStack_148 = plVar6[3];
    plVar9 = &local_150;
  }
  else {
    local_150 = *plVar8;
    plVar9 = (long *)*plVar6;
  }
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  firstReplacement_00._M_str = (char *)plVar9;
  firstReplacement_00._M_len = in_stack_fffffffffffffe98;
  firstToReplace_00._M_str = (char *)local_a0->_M_string_length;
  firstToReplace_00._M_len = (size_t)plVar9;
  choc::text::replace<std::__cxx11::string>
            (local_98,(text *)local_90,pbVar2,firstToReplace_00,firstReplacement_00);
  if (plVar9 != &local_150) {
    operator_delete(plVar9,local_150 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  return psVar4;
}

Assistant:

static std::string replaceArgument (std::string text, size_t index, const std::string& value)
    {
        auto i = std::to_string (index);
        text = choc::text::replace (text, "$Q" + i + "$", choc::text::addSingleQuotes (value));
        return choc::text::replace (text, "$" + i + "$", value);
    }